

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_stream.hpp
# Opt level: O2

size_t __thiscall
io::detail::memory_stream_impl<io::basic_string_view_stream<char,_std::char_traits<char>_>,_long>::
read_some<io::net::mutable_buffer>
          (memory_stream_impl<io::basic_string_view_stream<char,_std::char_traits<char>_>,_long>
           *this,mutable_buffer *mb,error_code *ec)

{
  ulong uVar1;
  ulong uVar2;
  ulong __n;
  
  std::error_code::clear(ec);
  uVar1 = this->pos_;
  uVar2 = this[1].pos_;
  if (uVar1 == uVar2) {
    std::error_code::operator=(ec,eof);
    uVar1 = this->pos_;
    uVar2 = this[1].pos_;
  }
  if (uVar2 < uVar1) {
    uVar1 = uVar2;
  }
  __n = uVar2 - uVar1;
  if (mb->size_ < uVar2 - uVar1) {
    __n = mb->size_;
  }
  memcpy(mb->data_,(void *)(uVar1 + this[2].pos_),__n);
  this->pos_ = this->pos_ + __n;
  return __n;
}

Assistant:

std::size_t read_some(const MutBufSeq& mb, std::error_code& ec) noexcept
    {
        static_assert(io::is_mutable_buffer_sequence_v<MutBufSeq>,
                      "Argument passed to read_some() is not a MutableBufferSequence");

        ec.clear();

        if (pos_ == this->size()) {
            ec = stream_errc::eof;
        }

        auto bytes_copied = io::buffer_copy(mb, this->buffer());
        pos_ += bytes_copied;

        return bytes_copied;
    }